

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O0

UChar * u_memrchr_63(UChar *s,UChar c,int32_t count)

{
  UChar *pUVar1;
  UChar *local_28;
  UChar *limit;
  int32_t count_local;
  UChar c_local;
  UChar *s_local;
  
  if (count < 1) {
    s_local = (UChar *)0x0;
  }
  else if ((c & 0xf800U) == 0xd800) {
    limit._0_4_ = count;
    limit._6_2_ = c;
    _count_local = s;
    s_local = u_strFindLast_63(s,count,(UChar *)((long)&limit + 6),1);
  }
  else {
    local_28 = s + count;
    do {
      pUVar1 = local_28 + -1;
      if (local_28[-1] == c) {
        return pUVar1;
      }
      local_28 = pUVar1;
    } while (s != pUVar1);
    s_local = (UChar *)0x0;
  }
  return s_local;
}

Assistant:

U_CAPI UChar * U_EXPORT2
u_memrchr(const UChar *s, UChar c, int32_t count) {
    if(count<=0) {
        return NULL; /* no string */
    } else if(U16_IS_SURROGATE(c)) {
        /* make sure to not find half of a surrogate pair */
        return u_strFindLast(s, count, &c, 1);
    } else {
        /* trivial search for a BMP code point */
        const UChar *limit=s+count;
        do {
            if(*(--limit)==c) {
                return (UChar *)limit;
            }
        } while(s!=limit);
        return NULL;
    }
}